

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_attribute_decoder.cc
# Opt level: O2

PointAttribute * __thiscall
draco::SequentialAttributeDecoder::GetPortableAttribute(SequentialAttributeDecoder *this)

{
  PointAttribute *pPVar1;
  pointer pIVar2;
  PointAttribute *this_00;
  PointIndex i;
  ulong uVar3;
  
  pPVar1 = this->attribute_;
  this_00 = (this->portable_attribute_)._M_t.
            super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
            ._M_t.
            super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
            .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl;
  if (pPVar1->identity_mapping_ == false) {
    if (this_00 == (PointAttribute *)0x0) {
      this_00 = (PointAttribute *)0x0;
    }
    else if (this_00->identity_mapping_ == true) {
      PointAttribute::SetExplicitMapping
                (this_00,(long)(pPVar1->indices_map_).vector_.
                               super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pPVar1->indices_map_).vector_.
                               super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 2);
      pPVar1 = this->attribute_;
      this_00 = (this->portable_attribute_)._M_t.
                super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                ._M_t.
                super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl;
      if (pPVar1->identity_mapping_ == false) {
        for (uVar3 = 0;
            pIVar2 = (pPVar1->indices_map_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
            uVar3 < ((ulong)((long)(pPVar1->indices_map_).vector_.
                                   super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar2) >> 2 &
                    0xffffffff); uVar3 = uVar3 + 1) {
          *(uint *)(*(long *)&(this_00->indices_map_).vector_.
                              super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                              ._M_impl + uVar3 * 4) = pIVar2[uVar3].value_;
        }
      }
    }
  }
  return this_00;
}

Assistant:

const PointAttribute *SequentialAttributeDecoder::GetPortableAttribute() {
  // If needed, copy point to attribute value index mapping from the final
  // attribute to the portable attribute.
  if (!attribute_->is_mapping_identity() && portable_attribute_ &&
      portable_attribute_->is_mapping_identity()) {
    portable_attribute_->SetExplicitMapping(attribute_->indices_map_size());
    for (PointIndex i(0);
         i < static_cast<uint32_t>(attribute_->indices_map_size()); ++i) {
      portable_attribute_->SetPointMapEntry(i, attribute_->mapped_index(i));
    }
  }
  return portable_attribute_.get();
}